

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

void __thiscall ExecutorX86::~ExecutorX86(ExecutorX86 *this)

{
  (*(code *)NULLC::dealloc)(this->execErrorBuffer);
  NULLC::AllowMemoryPageRead((this->vmState).callStackEnd);
  NULLC::AllowMemoryPageRead((this->vmState).dataStackEnd);
  NULLC::AllowMemoryPageRead((this->vmState).regFileArrayEnd);
  (*(code *)NULLC::dealloc)((this->vmState).dataStackBase);
  (*(code *)NULLC::dealloc)((this->vmState).callStackBase);
  (*(code *)NULLC::dealloc)((this->vmState).tempStackArrayBase);
  (*(code *)NULLC::dealloc)((this->vmState).regFileArrayBase);
  ClearNative(this);
  NULLC::MemProtect(this->codeLaunchHeader,0x1000,3);
  if (this->binCode != (uchar *)0x0) {
    NULLC::MemProtect(this->binCode,this->binCodeSize,3);
  }
  (*(code *)NULLC::dealloc)(this->codeLaunchWin64UnwindTable);
  (*(code *)NULLC::dealloc)(this->binCode);
  NULLC::currExecutor = 0;
  x86ResetLabels();
  FastVector<ExecutorX86::Breakpoint,_false,_false>::~FastVector(&this->breakInstructions);
  FastVector<_RUNTIME_FUNCTION,_false,_false>::~FastVector(&this->functionWin64UnwindTable);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->globalCodeRanges);
  FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::~FastVector
            (&this->expiredFunctionAddressLists);
  FastVector<unsigned_char_*,_false,_false>::~FastVector(&this->functionAddress);
  FastVector<unsigned_char_*,_false,_false>::~FastVector(&this->instAddress);
  FastVector<x86Instruction,_true,_true>::~FastVector(&this->instList);
  FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::~FastVector(&this->expiredCodeBlocks);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->codeRegKillInfoOffsets);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->codeJumpTargets);
  return;
}

Assistant:

ExecutorX86::~ExecutorX86()
{
	NULLC::dealloc(execErrorBuffer);

	NULLC::AllowMemoryPageRead(vmState.callStackEnd);
	NULLC::AllowMemoryPageRead(vmState.dataStackEnd);
	NULLC::AllowMemoryPageRead(vmState.regFileArrayEnd);

	NULLC::dealloc(vmState.dataStackBase);

	NULLC::dealloc(vmState.callStackBase);

	NULLC::dealloc(vmState.tempStackArrayBase);

	NULLC::dealloc(vmState.regFileArrayBase);

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(dcCallVM)
		dcFree(dcCallVM);
#endif

	ClearNative();

	// Disable execution of code head and code body
#ifndef __linux
	DWORD unusedProtect;
	VirtualProtect((void*)codeLaunchHeader, codeLaunchHeaderSize, oldCodeLaunchHeaderProtect, &unusedProtect);
	if(binCode)
		VirtualProtect((void*)binCode, binCodeSize, oldCodeBodyProtect, &unusedProtect);
#else
	NULLC::MemProtect((void*)codeLaunchHeader, codeLaunchHeaderSize, PROT_READ | PROT_WRITE);
	if(binCode)
		NULLC::MemProtect((void*)binCode, binCodeSize, PROT_READ | PROT_WRITE);
#endif

	NULLC::dealloc(codeLaunchWin64UnwindTable);

	NULLC::dealloc(binCode);

	NULLC::currExecutor = NULL;

	x86ResetLabels();
}